

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventfd-uni.c
# Opt level: O2

void client_communicate(int descriptor,Arguments *args)

{
  int iVar1;
  uint64_t in_RAX;
  ssize_t sVar2;
  uint64_t timestamp;
  
  iVar1 = args->count;
  timestamp = in_RAX;
  while( true ) {
    if (iVar1 < 1) {
      return;
    }
    timestamp = now();
    sVar2 = write(descriptor,&timestamp,8);
    if (sVar2 == -1) break;
    iVar1 = args->count + -1;
    args->count = iVar1;
  }
  throw("Error writing to eventfd");
}

Assistant:

void client_communicate(int descriptor, struct Arguments* args) {
	uint64_t timestamp;

	for (; args->count > 0; --args->count) {
		timestamp = now();

		// A write *adds* the value stored in the
		// eventfd to the value in the 8-byte buffer passed.
		// Here we send the current timestamp to the server
		if (write(descriptor, &timestamp, 8) == -1) {
			throw("Error writing to eventfd");
		}
	}
}